

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void __thiscall
QtPrivate::QTypeNormalizer::normalizeIntegerTypes(QTypeNormalizer *this,char **begin,char *end)

{
  bool bVar1;
  ulong in_RDX;
  ulong *in_RSI;
  QTypeNormalizer *in_RDI;
  int numChar;
  int numShort;
  int numInt;
  int numUnsigned;
  int numSigned;
  int numLong;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  local_20 = 0;
  iVar5 = 0;
  iVar4 = 0;
  uVar3 = 0;
  iVar2 = 0;
  while (*in_RSI < in_RDX) {
    bVar1 = skipToken((char **)CONCAT44(iVar5,iVar4),(char *)CONCAT44(uVar3,iVar2),(char *)in_RDI,
                      false);
    if (bVar1) {
      local_1c = local_1c + 1;
    }
    else {
      bVar1 = skipToken((char **)CONCAT44(iVar5,iVar4),(char *)CONCAT44(uVar3,iVar2),(char *)in_RDI,
                        false);
      if (bVar1) {
        iVar4 = iVar4 + 1;
      }
      else {
        bVar1 = skipToken((char **)CONCAT44(iVar5,iVar4),(char *)CONCAT44(uVar3,iVar2),
                          (char *)in_RDI,false);
        if (bVar1) {
          uVar3 = uVar3 + 1;
        }
        else {
          bVar1 = skipToken((char **)CONCAT44(iVar5,iVar4),(char *)CONCAT44(uVar3,iVar2),
                            (char *)in_RDI,false);
          if (bVar1) {
            iVar5 = iVar5 + 1;
          }
          else {
            bVar1 = skipToken((char **)CONCAT44(iVar5,iVar4),(char *)CONCAT44(uVar3,iVar2),
                              (char *)in_RDI,false);
            if (bVar1) {
              local_20 = local_20 + 1;
            }
            else {
              bVar1 = skipToken((char **)CONCAT44(iVar5,iVar4),(char *)CONCAT44(uVar3,iVar2),
                                (char *)in_RDI,false);
              if (!bVar1) break;
              iVar2 = iVar2 + 1;
            }
          }
        }
      }
    }
  }
  if (local_1c == 2) {
    append(in_RDI,'q');
  }
  if ((local_20 == 0) || (iVar2 == 0)) {
    if (iVar5 != 0) {
      appendStr((QTypeNormalizer *)CONCAT44(uVar3,iVar2),(char *)in_RDI);
    }
  }
  else {
    appendStr((QTypeNormalizer *)CONCAT44(uVar3,iVar2),(char *)in_RDI);
  }
  if (iVar2 == 0) {
    if (uVar3 == 0) {
      if (local_1c == 1) {
        appendStr((QTypeNormalizer *)0x0,(char *)in_RDI);
      }
      else if (local_1c == 2) {
        appendStr((QTypeNormalizer *)0x0,(char *)in_RDI);
      }
      else if (((iVar5 != 0) || (local_20 != 0)) || (iVar4 != 0)) {
        appendStr((QTypeNormalizer *)0x0,(char *)in_RDI);
      }
    }
    else {
      appendStr((QTypeNormalizer *)((ulong)uVar3 << 0x20),(char *)in_RDI);
    }
  }
  else {
    appendStr((QTypeNormalizer *)CONCAT44(uVar3,iVar2),(char *)in_RDI);
  }
  return;
}

Assistant:

constexpr void normalizeIntegerTypes(const char *&begin, const char *end)
    {
        int numLong = 0;
        int numSigned = 0;
        int numUnsigned = 0;
        int numInt = 0;
        int numShort = 0;
        int numChar = 0;
        while (begin < end) {
            if (skipToken(begin, end, "long")) {
                numLong++;
                continue;
            }
            if (skipToken(begin, end, "int")) {
                numInt++;
                continue;
            }
            if (skipToken(begin, end, "short")) {
                numShort++;
                continue;
            }
            if (skipToken(begin, end, "unsigned")) {
                numUnsigned++;
                continue;
            }
            if (skipToken(begin, end, "signed")) {
                numSigned++;
                continue;
            }
            if (skipToken(begin, end, "char")) {
                numChar++;
                continue;
            }
#ifdef Q_CC_MSVC
            if (skipToken(begin, end, "__int64")) {
                numLong = 2;
                continue;
            }
#endif
            break;
        }
        if (numLong == 2)
            append('q'); // q(u)longlong
        if (numSigned && numChar)
            appendStr("signed ");
        else if (numUnsigned)
            appendStr("u");
        if (numChar)
            appendStr("char");
        else if (numShort)
            appendStr("short");
        else if (numLong == 1)
            appendStr("long");
        else if (numLong == 2)
            appendStr("longlong");
        else if (numUnsigned || numSigned || numInt)
            appendStr("int");
    }